

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::TileIndependenceLSTestLarge_MD5Match_Test>::
CreateTest(ParameterizedTestFactory<(anonymous_namespace)::TileIndependenceLSTestLarge_MD5Match_Test>
           *this)

{
  TileIndependenceTest *this_00;
  
  WithParamInterface<std::tuple<libaom_test::CodecFactory_const*,int,int,int>>::parameter_ =
       &this->parameter_;
  this_00 = (TileIndependenceTest *)operator_new(0x510);
  anon_unknown.dwarf_ce2064::TileIndependenceTest::TileIndependenceTest(this_00);
  (this_00->super_CodecTestWith3Params<int,_int,_int>).
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_int,_int,_int>_>.super_Test.
  _vptr_Test = (_func_int **)&PTR__TileIndependenceTest_01017750;
  (this_00->super_CodecTestWith3Params<int,_int,_int>).
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_int,_int,_int>_>.
  super_WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_int,_int,_int>_>.
  _vptr_WithParamInterface = (_func_int **)&PTR__TileIndependenceLSTestLarge_MD5Match_Test_010177a8;
  (this_00->super_EncoderTest)._vptr_EncoderTest =
       (_func_int **)&PTR__TileIndependenceLSTestLarge_MD5Match_Test_010177c8;
  return (Test *)this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }